

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O1

int ncnn::reduction_op<ncnn::reduction_op_add<float>,ncnn::reduction_op_add<float>>
              (Mat *a,Mat *b,float v0,bool reduce_w,bool reduce_h,bool reduce_c,Option *opt)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  int *piVar6;
  uint uVar7;
  uint uVar8;
  void *pvVar9;
  long lVar10;
  void *pvVar11;
  int unaff_EBP;
  bool bVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  void *pvVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  float fVar22;
  Mat sums;
  Mat local_78;
  
  sVar3 = a->elemsize;
  iVar1 = a->dims;
  if (iVar1 == 2) {
    uVar8 = a->w;
    uVar15 = (ulong)uVar8;
    uVar7 = a->h;
    uVar16 = (ulong)uVar7;
    if (reduce_w && reduce_h) {
      Mat::create(b,1,sVar3,opt->blob_allocator);
      local_78.cstep = 0;
      local_78.data = (void *)0x0;
      local_78.refcount._0_4_ = 0;
      local_78.refcount._4_4_ = 0;
      local_78.elemsize._0_4_ = 0;
      local_78.elemsize._4_4_ = 0;
      local_78.elempack = 0;
      local_78.allocator = (Allocator *)0x0;
      local_78.dims = 0;
      local_78.w = 0;
      local_78.h = 0;
      local_78.d = 0;
      local_78.c = 0;
      Mat::create(&local_78,uVar7,sVar3,opt->workspace_allocator);
      unaff_EBP = -100;
      if ((local_78.data != (void *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
        if (0 < (int)uVar7) {
          pvVar9 = a->data;
          iVar2 = a->w;
          sVar4 = a->elemsize;
          uVar13 = 0;
          do {
            fVar22 = 0.0;
            if (0 < (int)uVar8) {
              uVar18 = 0;
              do {
                fVar22 = fVar22 + *(float *)((long)pvVar9 + uVar18 * 4);
                uVar18 = uVar18 + 1;
              } while (uVar15 != uVar18);
            }
            *(float *)((long)local_78.data + uVar13 * 4) = fVar22;
            uVar13 = uVar13 + 1;
            pvVar9 = (void *)((long)pvVar9 + (long)iVar2 * sVar4);
          } while (uVar13 != uVar16);
        }
        fVar22 = 0.0;
        if (0 < (int)uVar7) {
          uVar15 = 0;
          do {
            fVar22 = fVar22 + *(float *)((long)local_78.data + uVar15 * 4);
            uVar15 = uVar15 + 1;
          } while (uVar16 != uVar15);
        }
        *(float *)b->data = fVar22;
        unaff_EBP = 0;
      }
      piVar6 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_78.allocator == (Allocator *)0x0) {
            if (local_78.data != (void *)0x0) {
              free(local_78.data);
            }
          }
          else {
            (*(local_78.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      bVar12 = false;
    }
    else if (reduce_w && !reduce_h) {
      Mat::create(b,uVar7,sVar3,opt->blob_allocator);
      if (0 < (int)uVar7) {
        pvVar9 = a->data;
        iVar2 = a->w;
        sVar4 = a->elemsize;
        pvVar11 = b->data;
        uVar13 = 0;
        do {
          fVar22 = 0.0;
          if (0 < (int)uVar8) {
            uVar18 = 0;
            do {
              fVar22 = fVar22 + *(float *)((long)pvVar9 + uVar18 * 4);
              uVar18 = uVar18 + 1;
            } while (uVar15 != uVar18);
          }
          *(float *)((long)pvVar11 + uVar13 * 4) = fVar22;
          uVar13 = uVar13 + 1;
          pvVar9 = (void *)((long)pvVar9 + (long)iVar2 * sVar4);
        } while (uVar13 != uVar16);
        goto LAB_0020eda4;
      }
      bVar12 = false;
      unaff_EBP = 0;
    }
    else if (reduce_h && !reduce_w) {
      Mat::create(b,uVar8,sVar3,opt->blob_allocator);
      uVar14 = b->c * (int)b->cstep;
      if (0 < (int)uVar14) {
        memset(b->data,0,(ulong)uVar14 << 2);
      }
      if (0 < (int)uVar7) {
        pvVar9 = a->data;
        iVar2 = a->w;
        sVar4 = a->elemsize;
        pvVar11 = b->data;
        uVar13 = 0;
        do {
          if (0 < (int)uVar8) {
            uVar18 = 0;
            do {
              *(float *)((long)pvVar11 + uVar18 * 4) =
                   *(float *)((long)pvVar9 + uVar18 * 4) + *(float *)((long)pvVar11 + uVar18 * 4);
              uVar18 = uVar18 + 1;
            } while (uVar15 != uVar18);
          }
          uVar13 = uVar13 + 1;
          pvVar9 = (void *)((long)pvVar9 + (long)iVar2 * sVar4);
        } while (uVar13 != uVar16);
      }
LAB_0020eda4:
      bVar12 = false;
      unaff_EBP = 0;
    }
    else {
      bVar12 = true;
    }
    if (!bVar12) {
      return unaff_EBP;
    }
  }
  else if (iVar1 == 1) {
    iVar1 = a->w;
    Mat::create(b,1,sVar3,opt->blob_allocator);
    if ((long)iVar1 < 1) {
      fVar22 = 0.0;
    }
    else {
      fVar22 = 0.0;
      lVar10 = 0;
      do {
        fVar22 = fVar22 + *(float *)((long)a->data + lVar10 * 4);
        lVar10 = lVar10 + 1;
      } while (iVar1 != lVar10);
    }
    *(float *)b->data = fVar22;
    return 0;
  }
  if (iVar1 != 3) {
    return 0;
  }
  uVar8 = a->w;
  uVar15 = (ulong)uVar8;
  uVar7 = a->h;
  uVar16 = (ulong)uVar7;
  uVar14 = a->c;
  uVar13 = (ulong)uVar14;
  uVar20 = uVar7 * uVar8;
  bVar12 = !reduce_w;
  if ((!bVar12 && reduce_h) && reduce_c) {
    Mat::create(b,1,sVar3,opt->blob_allocator);
    local_78.cstep = 0;
    local_78.data = (void *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78.elemsize._4_4_ = 0;
    local_78.elempack = 0;
    local_78.allocator = (Allocator *)0x0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    Mat::create(&local_78,uVar14,sVar3,opt->workspace_allocator);
    unaff_EBP = -100;
    if ((local_78.data != (void *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
      if (0 < (int)uVar14) {
        pvVar9 = a->data;
        sVar3 = a->cstep;
        sVar4 = a->elemsize;
        uVar16 = 0;
        do {
          fVar22 = 0.0;
          if (0 < (int)uVar20) {
            uVar15 = 0;
            do {
              fVar22 = fVar22 + *(float *)((long)pvVar9 + uVar15 * 4);
              uVar15 = uVar15 + 1;
            } while (uVar20 != uVar15);
          }
          *(float *)((long)local_78.data + uVar16 * 4) = fVar22;
          uVar16 = uVar16 + 1;
          pvVar9 = (void *)((long)pvVar9 + sVar3 * sVar4);
        } while (uVar16 != uVar13);
      }
      fVar22 = 0.0;
      if (0 < (int)uVar14) {
        uVar16 = 0;
        do {
          fVar22 = fVar22 + *(float *)((long)local_78.data + uVar16 * 4);
          uVar16 = uVar16 + 1;
        } while (uVar13 != uVar16);
      }
      *(float *)b->data = fVar22;
      unaff_EBP = 0;
    }
    piVar6 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if (local_78.data != (void *)0x0) {
            free(local_78.data);
          }
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
LAB_0020f478:
    bVar12 = false;
  }
  else {
    if ((!bVar12 && reduce_h) && !reduce_c) {
      Mat::create(b,uVar14,sVar3,opt->blob_allocator);
      if (0 < (int)uVar14) {
        pvVar9 = a->data;
        sVar3 = a->cstep;
        pvVar11 = b->data;
        sVar4 = a->elemsize;
        uVar16 = 0;
        do {
          fVar22 = 0.0;
          if (0 < (int)uVar20) {
            uVar15 = 0;
            do {
              fVar22 = fVar22 + *(float *)((long)pvVar9 + uVar15 * 4);
              uVar15 = uVar15 + 1;
            } while (uVar20 != uVar15);
          }
          *(float *)((long)pvVar11 + uVar16 * 4) = fVar22;
          uVar16 = uVar16 + 1;
          pvVar9 = (void *)((long)pvVar9 + sVar3 * sVar4);
        } while (uVar16 != uVar13);
      }
    }
    else {
      lVar10 = (long)(int)uVar8;
      if ((bVar12 || reduce_h) || reduce_c) {
        if ((!bVar12 && !reduce_h) && reduce_c) {
          Mat::create(b,uVar7,sVar3,opt->blob_allocator);
          local_78.cstep = 0;
          local_78.data = (void *)0x0;
          local_78.refcount._0_4_ = 0;
          local_78.refcount._4_4_ = 0;
          local_78.elemsize._0_4_ = 0;
          local_78.elemsize._4_4_ = 0;
          local_78.elempack = 0;
          local_78.allocator = (Allocator *)0x0;
          local_78.dims = 0;
          local_78.w = 0;
          local_78.h = 0;
          local_78.d = 0;
          local_78.c = 0;
          Mat::create(&local_78,1,uVar7,uVar14,sVar3,opt->workspace_allocator);
          unaff_EBP = -100;
          if ((local_78.data != (void *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
            if (0 < local_78.c * (int)local_78.cstep) {
              memset(local_78.data,0,(ulong)(uint)(local_78.c * (int)local_78.cstep) << 2);
            }
            if (0 < (int)uVar14) {
              pvVar9 = a->data;
              sVar3 = a->cstep;
              sVar4 = a->elemsize;
              uVar18 = 0;
              do {
                if (0 < (int)uVar7) {
                  uVar19 = 0;
                  pvVar11 = pvVar9;
                  do {
                    fVar22 = 0.0;
                    if (0 < (int)uVar8) {
                      uVar21 = 0;
                      do {
                        fVar22 = fVar22 + *(float *)((long)pvVar11 + uVar21 * 4);
                        uVar21 = uVar21 + 1;
                      } while (uVar15 != uVar21);
                    }
                    *(float *)((long)local_78.data +
                              uVar19 * 4 +
                              local_78.cstep *
                              CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize) *
                              uVar18) = fVar22;
                    uVar19 = uVar19 + 1;
                    pvVar11 = (void *)((long)pvVar11 + lVar10 * 4);
                  } while (uVar19 != uVar16);
                }
                uVar18 = uVar18 + 1;
                pvVar9 = (void *)((long)pvVar9 + sVar3 * sVar4);
              } while (uVar18 != uVar13);
            }
            uVar8 = b->c * (int)b->cstep;
            if (0 < (int)uVar8) {
              memset(b->data,0,(ulong)uVar8 << 2);
            }
            if (0 < (int)uVar14) {
              pvVar9 = b->data;
              uVar15 = 0;
              pvVar11 = local_78.data;
              do {
                if (0 < (int)uVar7) {
                  uVar18 = 0;
                  do {
                    *(float *)((long)pvVar9 + uVar18 * 4) =
                         *(float *)((long)pvVar11 + uVar18 * 4) +
                         *(float *)((long)pvVar9 + uVar18 * 4);
                    uVar18 = uVar18 + 1;
                  } while (uVar16 != uVar18);
                }
                uVar15 = uVar15 + 1;
                pvVar11 = (void *)((long)pvVar11 +
                                  local_78.cstep *
                                  CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
              } while (uVar15 != uVar13);
            }
LAB_0020f46c:
            unaff_EBP = 0;
          }
        }
        else {
          if ((!reduce_h || reduce_w) || !reduce_c) {
            if ((!reduce_w && !reduce_h) && reduce_c) {
              Mat::create(b,uVar8,uVar7,sVar3,opt->blob_allocator);
              uVar8 = b->c * (int)b->cstep;
              if (0 < (int)uVar8) {
                memset(b->data,0,(ulong)uVar8 << 2);
              }
              if (0 < (int)uVar14) {
                pvVar9 = a->data;
                sVar3 = a->cstep;
                pvVar11 = b->data;
                sVar4 = a->elemsize;
                uVar16 = 0;
                unaff_EBP = 0;
                do {
                  if (0 < (int)uVar20) {
                    uVar15 = 0;
                    do {
                      *(float *)((long)pvVar11 + uVar15 * 4) =
                           *(float *)((long)pvVar9 + uVar15 * 4) +
                           *(float *)((long)pvVar11 + uVar15 * 4);
                      uVar15 = uVar15 + 1;
                    } while (uVar20 != uVar15);
                  }
                  uVar16 = uVar16 + 1;
                  pvVar9 = (void *)((long)pvVar9 + sVar3 * sVar4);
                  bVar12 = false;
                } while (uVar16 != uVar13);
                goto LAB_0020f47a;
              }
            }
            else {
              bVar12 = true;
              if ((!reduce_h || reduce_w) || reduce_c) goto LAB_0020f47a;
              Mat::create(b,uVar8,uVar14,sVar3,opt->blob_allocator);
              uVar20 = b->c * (int)b->cstep;
              if (0 < (int)uVar20) {
                memset(b->data,0,(ulong)uVar20 << 2);
              }
              if (0 < (int)uVar14) {
                pvVar9 = a->data;
                sVar3 = a->cstep;
                pvVar11 = b->data;
                iVar1 = b->w;
                sVar4 = a->elemsize;
                sVar5 = b->elemsize;
                uVar16 = 0;
                unaff_EBP = 0;
                do {
                  if (0 < (int)uVar7) {
                    uVar14 = 0;
                    pvVar17 = pvVar9;
                    do {
                      if (0 < (int)uVar8) {
                        uVar18 = 0;
                        do {
                          *(float *)((long)pvVar11 + uVar18 * 4) =
                               *(float *)((long)pvVar17 + uVar18 * 4) +
                               *(float *)((long)pvVar11 + uVar18 * 4);
                          uVar18 = uVar18 + 1;
                        } while (uVar15 != uVar18);
                      }
                      uVar14 = uVar14 + 1;
                      pvVar17 = (void *)((long)pvVar17 + lVar10 * 4);
                    } while (uVar14 != uVar7);
                  }
                  uVar16 = uVar16 + 1;
                  pvVar9 = (void *)((long)pvVar9 + sVar3 * sVar4);
                  pvVar11 = (void *)((long)pvVar11 + (long)iVar1 * sVar5);
                  bVar12 = false;
                } while (uVar16 != uVar13);
                goto LAB_0020f47a;
              }
            }
            goto LAB_0020f15e;
          }
          Mat::create(b,uVar8,sVar3,opt->blob_allocator);
          local_78.cstep = 0;
          local_78.data = (void *)0x0;
          local_78.refcount._0_4_ = 0;
          local_78.refcount._4_4_ = 0;
          local_78.elemsize._0_4_ = 0;
          local_78.elemsize._4_4_ = 0;
          local_78.elempack = 0;
          local_78.allocator = (Allocator *)0x0;
          local_78.dims = 0;
          local_78.w = 0;
          local_78.h = 0;
          local_78.d = 0;
          local_78.c = 0;
          Mat::create(&local_78,uVar8,1,uVar14,sVar3,opt->workspace_allocator);
          unaff_EBP = -100;
          if ((local_78.data != (void *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
            if (0 < local_78.c * (int)local_78.cstep) {
              memset(local_78.data,0,(ulong)(uint)(local_78.c * (int)local_78.cstep) << 2);
            }
            if (0 < (int)uVar14) {
              pvVar9 = a->data;
              sVar3 = a->cstep;
              sVar4 = a->elemsize;
              uVar16 = 0;
              pvVar11 = local_78.data;
              do {
                if (0 < (int)uVar7) {
                  uVar20 = 0;
                  pvVar17 = pvVar9;
                  do {
                    if (0 < (int)uVar8) {
                      uVar18 = 0;
                      do {
                        *(float *)((long)pvVar11 + uVar18 * 4) =
                             *(float *)((long)pvVar17 + uVar18 * 4) +
                             *(float *)((long)pvVar11 + uVar18 * 4);
                        uVar18 = uVar18 + 1;
                      } while (uVar15 != uVar18);
                    }
                    uVar20 = uVar20 + 1;
                    pvVar17 = (void *)((long)pvVar17 + lVar10 * 4);
                  } while (uVar20 != uVar7);
                }
                uVar16 = uVar16 + 1;
                pvVar9 = (void *)((long)pvVar9 + sVar3 * sVar4);
                pvVar11 = (void *)((long)pvVar11 +
                                  local_78.cstep *
                                  CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
              } while (uVar16 != uVar13);
            }
            uVar7 = b->c * (int)b->cstep;
            if (0 < (int)uVar7) {
              memset(b->data,0,(ulong)uVar7 << 2);
            }
            if (0 < (int)uVar14) {
              pvVar9 = b->data;
              uVar16 = 0;
              pvVar11 = local_78.data;
              do {
                if (0 < (int)uVar8) {
                  uVar18 = 0;
                  do {
                    *(float *)((long)pvVar9 + uVar18 * 4) =
                         *(float *)((long)pvVar11 + uVar18 * 4) +
                         *(float *)((long)pvVar9 + uVar18 * 4);
                    uVar18 = uVar18 + 1;
                  } while (uVar15 != uVar18);
                }
                uVar16 = uVar16 + 1;
                pvVar11 = (void *)((long)pvVar11 +
                                  local_78.cstep *
                                  CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
              } while (uVar16 != uVar13);
            }
            goto LAB_0020f46c;
          }
        }
        Mat::~Mat(&local_78);
        goto LAB_0020f478;
      }
      Mat::create(b,uVar7,uVar14,sVar3,opt->blob_allocator);
      if (0 < (int)uVar14) {
        pvVar9 = a->data;
        sVar3 = a->cstep;
        iVar1 = b->w;
        sVar4 = b->elemsize;
        sVar5 = a->elemsize;
        pvVar11 = b->data;
        uVar18 = 0;
        do {
          if (0 < (int)uVar7) {
            uVar19 = 0;
            pvVar17 = pvVar9;
            do {
              fVar22 = 0.0;
              if (0 < (int)uVar8) {
                uVar21 = 0;
                do {
                  fVar22 = fVar22 + *(float *)((long)pvVar17 + uVar21 * 4);
                  uVar21 = uVar21 + 1;
                } while (uVar15 != uVar21);
              }
              *(float *)((long)pvVar11 + uVar19 * 4 + (long)iVar1 * sVar4 * uVar18) = fVar22;
              uVar19 = uVar19 + 1;
              pvVar17 = (void *)((long)pvVar17 + lVar10 * 4);
            } while (uVar19 != uVar16);
          }
          uVar18 = uVar18 + 1;
          pvVar9 = (void *)((long)pvVar9 + sVar3 * sVar5);
        } while (uVar18 != uVar13);
      }
    }
LAB_0020f15e:
    bVar12 = false;
    unaff_EBP = 0;
  }
LAB_0020f47a:
  if (bVar12) {
    return 0;
  }
  return unaff_EBP;
}

Assistant:

static int reduction_op(const Mat& a, Mat& b, float v0, bool reduce_w, bool reduce_h, bool reduce_c, const Option& opt)
{
    Op op;
    Op2 op2;

    size_t elemsize = a.elemsize;
    int dims = a.dims;

    if (dims == 1)
    {
        int w = a.w;
        b.create(1, elemsize, opt.blob_allocator);
        const float* ptr = a;

        float sum = v0;
        for (int i = 0; i < w; i++)
        {
            sum = op(sum, ptr[i]);
        }
        b[0] = sum;

        return 0;
    }

    if (dims == 2)
    {
        int w = a.w;
        int h = a.h;

        if (reduce_w && reduce_h)
        {
            // w h -> X X
            b.create(1, elemsize, opt.blob_allocator);

            Mat sums(h, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j = 0; j < w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                sums[i] = sum;
            }

            float sum = v0;
            for (int i = 0; i < h; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && !reduce_h)
        {
            // w h -> X h
            b.create(h, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j = 0; j < w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                b[i] = sum;
            }
            return 0;
        }

        if (!reduce_w && reduce_h)
        {
            // w h -> w X
            b.create(w, elemsize, opt.blob_allocator);
            b.fill(v0);

            for (int i = 0; i < h; i++)
            {
                const float* ptr = a.row(i);
                for (int j = 0; j < w; j++)
                {
                    b[j] = op(b[j], ptr[j]);
                }
            }
            return 0;
        }
    }

    if (dims == 3)
    {
        int w = a.w;
        int h = a.h;
        int channels = a.c;
        int size = w * h;

        if (reduce_w && reduce_h && reduce_c)
        {
            // w h c -> X X X
            b.create(1, elemsize, opt.blob_allocator);
            Mat sums(channels, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);

                float sum = v0;
                for (int i = 0; i < size; i++)
                {
                    sum = op(sum, ptr[i]);
                }
                sums[q] = sum;
            }

            float sum = v0;
            for (int i = 0; i < channels; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> X X c
            b.create(channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);

                float sum = v0;
                for (int i = 0; i < size; i++)
                {
                    sum = op(sum, ptr[i]);
                }
                b[q] = sum;
            }

            return 0;
        }

        if (reduce_w && !reduce_h && !reduce_c)
        {
            // w h c -> X h c
            b.create(h, channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.row(q);

                for (int i = 0; i < h; i++)
                {
                    float sum = v0;
                    for (int j = 0; j < w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    outptr[i] = sum;
                    ptr += w;
                }
            }

            return 0;
        }

        if (reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> X h X
            b.create(h, elemsize, opt.blob_allocator);
            Mat mins(1, h, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i = 0; i < h; i++)
                {
                    float sum = v0;
                    for (int j = 0; j < w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    mins_ptr[i] = sum;
                    ptr += w;
                }
            }

            b.fill(v0);

            for (int q = 0; q < channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int i = 0; i < h; i++)
                {
                    b[i] = op2(b[i], mins_ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && reduce_c)
        {
            // w h c -> w X X
            b.create(w, elemsize, opt.blob_allocator);

            Mat mins(w, 1, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        mins_ptr[j] = op(mins_ptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }

            b.fill(v0);

            for (int q = 0; q < channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int j = 0; j < w; j++)
                {
                    b[j] = op2(b[j], mins_ptr[j]);
                }
            }

            return 0;
        }

        if (!reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> w h X
            b.create(w, h, elemsize, opt.blob_allocator);

            b.fill(v0);

            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);

                for (int i = 0; i < size; i++)
                {
                    b[i] = op(b[i], ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> w X c
            b.create(w, channels, elemsize, opt.blob_allocator);

            b.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.row(q);

                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        outptr[j] = op(outptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }
            return 0;
        }
    }

    return 0;
}